

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneUnsignedLongLongIntegerParameterAndValue_Test::testBody
          (TEST_MockParameterTest_expectOneUnsignedLongLongIntegerParameterAndValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  cpputest_ulonglong local_18;
  unsigned_long_long value;
  TEST_MockParameterTest_expectOneUnsignedLongLongIntegerParameterAndValue_Test *this_local;
  
  local_18 = 0xffffaaaaffffaaaa;
  value = (unsigned_long_long)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::SimpleString(&local_58,"parameter");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_58,local_18);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_68,"");
  pMVar2 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_88,"parameter");
  MockActualCall::withParameter
            ((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_88,local_18);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_98);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneUnsignedLongLongIntegerParameterAndValue)
{
    unsigned long long value = 0xFFFFAAAAFFFFAAAA;
    mock().expectOneCall("foo").withParameter("parameter", value);
    mock().actualCall("foo").withParameter("parameter", value);

    mock().checkExpectations();
}